

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_TransparentEqIntOverload,_std::allocator<int>_>
::set_ctrl(raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_TransparentEqIntOverload,_std::allocator<int>_>
           *this,size_t i,ctrl_t h)

{
  bool bVar1;
  ctrl_t h_local;
  size_t i_local;
  raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_TransparentEqIntOverload,_std::allocator<int>_>
  *this_local;
  
  if (i < this->capacity_) {
    bVar1 = IsFull(h);
    if (bVar1) {
      SanitizerUnpoisonObject<phmap::priv::(anonymous_namespace)::DecomposeType>(this->slots_ + i);
    }
    else {
      SanitizerPoisonObject<phmap::priv::(anonymous_namespace)::DecomposeType>(this->slots_ + i);
    }
    this->ctrl_[i] = h;
    this->ctrl_[(i - 0x10 & this->capacity_) + 1 + (this->capacity_ & 0xf)] = h;
    return;
  }
  __assert_fail("i < capacity_",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x8fb,
                "void phmap::priv::raw_hash_set<phmap::priv::(anonymous namespace)::DecomposePolicy, TransparentHashIntOverload, TransparentEqIntOverload, std::allocator<int>>::set_ctrl(size_t, ctrl_t) [Policy = phmap::priv::(anonymous namespace)::DecomposePolicy, Hash = TransparentHashIntOverload, Eq = TransparentEqIntOverload, Alloc = std::allocator<int>]"
               );
}

Assistant:

void set_ctrl(size_t i, ctrl_t h) {
        assert(i < capacity_);

        if (IsFull(h)) {
            SanitizerUnpoisonObject(slots_ + i);
        } else {
            SanitizerPoisonObject(slots_ + i);
        }

        ctrl_[i] = h;
        ctrl_[((i - Group::kWidth) & capacity_) + 1 +
              ((Group::kWidth - 1) & capacity_)] = h;
    }